

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_24::Inhabitator::breakNonNullableCycles(Inhabitator *this)

{
  uint uVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  bool bVar2;
  reference pHVar3;
  size_type sVar4;
  size_t sVar5;
  iterator __x;
  type *__x_00;
  type *__in;
  type *this_01;
  type *__y;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  _List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>
  position;
  FieldPos field;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>,_bool>
  pVar9;
  bool local_30a;
  int local_244;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_240;
  pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int> local_228;
  pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
  local_208;
  HeapType local_1e0;
  HeapType next;
  undefined1 local_1b8 [12];
  _Self local_1a8;
  _Self local_1a0;
  iterator it;
  HeapType heapType;
  type *idx;
  type *children;
  type *state;
  type *curr;
  _List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>
  local_150;
  pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
  *local_148;
  _List_node_base *local_140;
  undefined1 local_138;
  int local_12c;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_128;
  pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int> local_110;
  pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
  local_f0;
  key_type local_b8;
  HeapType root;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
  visiting;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  visited;
  Inhabitator *this_local;
  
  std::
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                   *)&visiting.List.
                      super__List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                      ._M_impl._M_node._M_size);
  InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
  ::InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                      *)&__range2);
  this_00 = this->types;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
  root.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&root);
    if (!bVar2) {
      InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
      ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                           *)&__range2);
      std::
      unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
      ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        *)&visiting.List.
                           super__List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                           ._M_impl._M_node._M_size);
      return;
    }
    pHVar3 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    local_b8.id = pHVar3->id;
    sVar4 = std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                     *)&visiting.List.
                        super__List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                        ._M_impl._M_node._M_size,&local_b8);
    if (sVar4 == 0) {
      sVar5 = InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
              ::size((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                      *)&__range2);
      if (sVar5 != 0) {
        __assert_fail("visiting.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                      ,0x332,
                      "void wasm::(anonymous namespace)::Inhabitator::breakNonNullableCycles()");
      }
      ::wasm::HeapType::getTypeChildren();
      local_12c = 0;
      std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>::
      pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_int,_true>
                (&local_110,&local_128,&local_12c);
      std::
      pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
      ::pair<wasm::HeapType_&,_true>(&local_f0,&local_b8,&local_110);
      pVar9 = InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
              ::insert((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                        *)&__range2,&local_f0);
      local_140 = (_List_node_base *)pVar9.first._M_node;
      local_138 = pVar9.second;
      std::
      pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
      ::~pair(&local_f0);
      std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>::~pair
                (&local_110);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_128);
      while (sVar5 = InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                     ::size((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                             *)&__range2), sVar5 != 0) {
        __x = InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
              ::end((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                     *)&__range2);
        local_150 = std::
                    prev<std::_List_iterator<std::pair<wasm::HeapType_const,std::pair<std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>>>>
                              (__x._M_node,1);
        local_148 = std::
                    _List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>
                    ::operator*(&local_150);
        __x_00 = std::
                 get<0ul,wasm::HeapType_const,std::pair<std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>>
                           (local_148);
        __in = std::
               get<1ul,wasm::HeapType_const,std::pair<std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>>
                         (local_148);
        this_01 = std::get<0ul,std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>
                            (__in);
        __y = std::get<1ul,std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>(__in);
        while (uVar1 = *__y,
              sVar6 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(this_01),
              uVar1 < sVar6) {
          pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                             (this_01,(ulong)*__y);
          bVar2 = Type::isRef(pvVar7);
          if (bVar2) {
            pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                               (this_01,(ulong)*__y);
            bVar2 = Type::isNullable(pvVar7);
            if (bVar2) {
              *__y = *__y + 1;
            }
            else {
              std::pair<wasm::HeapType,_unsigned_int>::pair<unsigned_int_&,_true>
                        ((pair<wasm::HeapType,_unsigned_int> *)&heapType,__x_00,__y);
              sVar8 = std::
                      unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                      ::count(&this->nullables,(key_type *)&heapType);
              if (sVar8 == 0) {
                pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                                   (this_01,(ulong)*__y);
                it._M_node = (_List_node_base *)Type::getHeapType(pvVar7);
                sVar4 = std::
                        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                        ::count((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                                 *)&visiting.List.
                                    super__List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                                    ._M_impl._M_node._M_size,(key_type *)&it);
                if (sVar4 == 0) {
                  bVar2 = HeapType::isSignature((HeapType *)&it);
                  if (bVar2) {
                    *__y = *__y + 1;
                  }
                  else {
                    local_1a0._M_node =
                         (_List_node_base *)
                         InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                         ::find((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                                 *)&__range2,(HeapType *)&it);
                    local_1a8._M_node =
                         (_List_node_base *)
                         InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                         ::end((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                                *)&__range2);
                    bVar2 = std::operator!=(&local_1a0,&local_1a8);
                    if (!bVar2) break;
                    std::pair<wasm::HeapType,_unsigned_int>::pair<unsigned_int_&,_true>
                              ((pair<wasm::HeapType,_unsigned_int> *)local_1b8,__x_00,__y);
                    field._12_4_ = 0;
                    field.first.id = local_1b8._0_8_;
                    field.second = local_1b8._8_4_;
                    markNullable(this,field);
                    *__y = *__y + 1;
                  }
                }
                else {
                  *__y = *__y + 1;
                }
              }
              else {
                *__y = *__y + 1;
              }
            }
          }
          else {
            *__y = *__y + 1;
          }
        }
        uVar1 = *__y;
        sVar6 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(this_01);
        if (uVar1 == sVar6) {
          std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    *)&visiting.List.
                       super__List_base<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>_>
                       ._M_impl._M_node._M_size,__x_00);
          next.id = (uintptr_t)
                    InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                    ::end((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                           *)&__range2);
          position = std::
                     prev<std::_List_iterator<std::pair<wasm::HeapType_const,std::pair<std::vector<wasm::Type,std::allocator<wasm::Type>>,unsigned_int>>>>
                               ((_List_iterator<std::pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>_>
                                 )next.id,1);
          InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
          ::erase((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                   *)&__range2,(iterator)position._M_node);
        }
        else {
          pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                             (this_01,(ulong)*__y);
          bVar2 = Type::isRef(pvVar7);
          local_30a = false;
          if (bVar2) {
            pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                               (this_01,(ulong)*__y);
            local_30a = Type::isNonNullable(pvVar7);
          }
          if (local_30a == false) {
            __assert_fail("children[idx].isRef() && children[idx].isNonNullable()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                          ,0x370,
                          "void wasm::(anonymous namespace)::Inhabitator::breakNonNullableCycles()")
            ;
          }
          uVar1 = *__y;
          *__y = uVar1 + 1;
          pvVar7 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                             (this_01,(ulong)uVar1);
          local_1e0 = Type::getHeapType(pvVar7);
          ::wasm::HeapType::getTypeChildren();
          local_244 = 0;
          std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>::
          pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_int,_true>
                    (&local_228,&local_240,&local_244);
          std::
          pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
          ::pair<wasm::HeapType_&,_true>(&local_208,&local_1e0,&local_228);
          InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
          ::insert((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                    *)&__range2,&local_208);
          std::
          pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
          ::~pair(&local_208);
          std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>::~pair
                    (&local_228);
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_240);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void Inhabitator::breakNonNullableCycles() {
  // Types we've finished visiting. We don't need to visit them again.
  std::unordered_set<HeapType> visited;

  // The path of types we are currently visiting. If one of them comes back up,
  // we've found a cycle. Map the types to the other types they reference and
  // our current index into that list so we can track where we are in each level
  // of the search.
  InsertOrderedMap<HeapType, std::pair<std::vector<Type>, Index>> visiting;

  for (auto root : types) {
    if (visited.count(root)) {
      continue;
    }
    assert(visiting.size() == 0);
    visiting.insert({root, {root.getTypeChildren(), 0}});

    while (visiting.size()) {
      auto& [curr, state] = *std::prev(visiting.end());
      auto& [children, idx] = state;

      while (idx < children.size()) {
        // Skip non-reference children because they cannot refer to other types.
        if (!children[idx].isRef()) {
          ++idx;
          continue;
        }
        // Skip nullable references because they don't cause uninhabitable
        // cycles.
        if (children[idx].isNullable()) {
          ++idx;
          continue;
        }
        // Skip references that we have already marked nullable to satisfy
        // subtyping constraints. TODO: We could take such nullable references
        // into account when detecting cycles by tracking where in the current
        // search path we have made references nullable.
        if (nullables.count({curr, idx})) {
          ++idx;
          continue;
        }
        // Skip references to types that we have finished visiting. We have
        // visited the full graph reachable from such references, so we know
        // they cannot cycle back to anything we are currently visiting.
        auto heapType = children[idx].getHeapType();
        if (visited.count(heapType)) {
          ++idx;
          continue;
        }
        // Skip references to function types. Functions types can always be
        // instantiated since functions can be created even with uninhabitable
        // params or results. Function references therefore break cycles that
        // would otherwise produce uninhabitability.
        if (heapType.isSignature()) {
          ++idx;
          continue;
        }
        // If this ref forms a cycle, break the cycle by marking it nullable and
        // continue.
        if (auto it = visiting.find(heapType); it != visiting.end()) {
          markNullable({curr, idx});
          ++idx;
          continue;
        }
        break;
      }

      // If we've finished the DFS on the current type, pop it off the search
      // path and continue searching the previous type.
      if (idx == children.size()) {
        visited.insert(curr);
        visiting.erase(std::prev(visiting.end()));
        continue;
      }

      // Otherwise we have a non-nullable reference we need to search.
      assert(children[idx].isRef() && children[idx].isNonNullable());
      auto next = children[idx++].getHeapType();
      visiting.insert({next, {next.getTypeChildren(), 0}});
    }
  }
}